

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O0

int Amap_ManMergeCountCuts(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  Amap_Cut_t AVar1;
  Amap_Cut_t AVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Amap_Obj_t *pAVar6;
  Amap_Obj_t *pAVar7;
  int local_68;
  int local_64;
  int local_58;
  int Counter;
  int iFan1;
  int iFan0;
  int iCompl1;
  int iCompl0;
  int c1;
  int c0;
  int Entry;
  Amap_Cut_t *pCut1;
  Amap_Cut_t *pCut0;
  Amap_Obj_t *pFanin1;
  Amap_Obj_t *pFanin0;
  Amap_Obj_t *pNode_local;
  Amap_Man_t *p_local;
  
  pAVar6 = Amap_ObjFanin0(p,pNode);
  pAVar7 = Amap_ObjFanin1(p,pNode);
  local_58 = 1;
  iCompl0 = 0;
  pCut1 = (Amap_Cut_t *)(pAVar6->field_11).pData;
  while (iCompl0 < (int)(*(uint *)&pAVar6->field_0x8 >> 0xc)) {
    iCompl1 = 0;
    _c0 = (Amap_Cut_t *)(pAVar7->field_11).pData;
    while (iCompl1 < (int)(*(uint *)&pAVar7->field_0x8 >> 0xc)) {
      AVar1 = *pCut1;
      uVar3 = Amap_ObjFaninC0(pNode);
      AVar2 = *_c0;
      uVar4 = Amap_ObjFaninC1(pNode);
      if (((uint)*pCut1 & 0xffff) == 0) {
        local_64 = 0;
      }
      else {
        local_64 = Abc_Var2Lit((uint)*pCut1 & 0xffff,(uint)AVar1 >> 0x10 & 1 ^ uVar3);
      }
      if (((uint)*_c0 & 0xffff) == 0) {
        local_68 = 0;
      }
      else {
        local_68 = Abc_Var2Lit((uint)*_c0 & 0xffff,(uint)AVar2 >> 0x10 & 1 ^ uVar4);
      }
      iVar5 = Amap_LibFindNode(p->pLib,local_64,local_68,
                               (uint)(((uint)*(undefined8 *)pNode & 7) == 5));
      local_58 = (uint)(-1 < iVar5) + local_58;
      iCompl1 = iCompl1 + 1;
      _c0 = Amap_ManCutNext(_c0);
    }
    iCompl0 = iCompl0 + 1;
    pCut1 = Amap_ManCutNext(pCut1);
  }
  return local_58;
}

Assistant:

int Amap_ManMergeCountCuts( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Amap_Obj_t * pFanin0 = Amap_ObjFanin0( p, pNode );
    Amap_Obj_t * pFanin1 = Amap_ObjFanin1( p, pNode );
    Amap_Cut_t * pCut0, * pCut1;
    int Entry, c0, c1, iCompl0, iCompl1, iFan0, iFan1;
    int Counter = 1;
    Amap_NodeForEachCut( pFanin0, pCut0, c0 )
    Amap_NodeForEachCut( pFanin1, pCut1, c1 )
    {
        iCompl0 = pCut0->fInv ^ Amap_ObjFaninC0(pNode);
        iCompl1 = pCut1->fInv ^ Amap_ObjFaninC1(pNode);
        iFan0   = !pCut0->iMat? 0: Abc_Var2Lit( pCut0->iMat, iCompl0 );
        iFan1   = !pCut1->iMat? 0: Abc_Var2Lit( pCut1->iMat, iCompl1 );
        Entry = Amap_LibFindNode( p->pLib, iFan0, iFan1, pNode->Type == AMAP_OBJ_XOR );
        Counter += ( Entry >=0 );
//        if ( Entry >=0 )
//            printf( "Full: %d + %d = %d\n", iFan0, iFan1, Entry );
    }
    return Counter;
}